

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  uVar12 = 0;
  uVar11 = 0;
  uVar9 = 0;
  while (lVar13 = slen - uVar9, uVar10 = uVar9, uVar9 <= slen && lVar13 != 0) {
    uVar8 = ~uVar9;
    lVar5 = 0;
    while( true ) {
      uVar10 = slen;
      if (lVar13 == lVar5) goto LAB_0012707d;
      if (src[lVar5 + uVar9] != ' ') break;
      uVar8 = uVar8 - 1;
      lVar5 = lVar5 + 1;
    }
    if (lVar13 == lVar5) break;
    bVar3 = src[lVar5 + uVar9];
    if (bVar3 == 0xd && 1 < (ulong)(lVar13 - lVar5)) {
      if (src[lVar5 + 1 + uVar9] != '\n') {
        bVar3 = 0xd;
        if ((int)lVar5 != 0) {
          return -0x2c;
        }
LAB_00127046:
        if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
            [bVar3] == 0x7f) {
          return -0x2c;
        }
        if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
            [bVar3] < 0x40 && uVar11 != 0) {
          return -0x2c;
        }
        uVar12 = uVar12 + 1;
      }
    }
    else if (bVar3 != 10) {
      if ((int)lVar5 != 0) {
        return -0x2c;
      }
      if (bVar3 == 0x3d) {
        if (1 < uVar11) {
          return -0x2c;
        }
        uVar11 = uVar11 + 1;
        bVar3 = 0x3d;
      }
      else if ((char)bVar3 < '\0') {
        return -0x2c;
      }
      goto LAB_00127046;
    }
    uVar9 = -uVar8;
  }
LAB_0012707d:
  if (uVar12 == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = ((uVar12 >> 3) * 6 - (ulong)uVar11) + (ulong)(((uint)uVar12 & 7) * 6 + 7 >> 3);
    iVar1 = -0x2a;
    if ((dst == (uchar *)0x0) || (dlen < sVar6)) goto LAB_00127179;
    uVar4 = 3;
    lVar13 = 0;
    uVar11 = 0;
    puVar7 = dst;
    for (sVar6 = 0; uVar10 != sVar6; sVar6 = sVar6 + 1) {
      uVar9 = (ulong)src[sVar6];
      if ((0x20 < uVar9) || ((0x100002400U >> (uVar9 & 0x3f) & 1) == 0)) {
        uVar4 = uVar4 - (uVar9 == 0x3d);
        uVar2 = uVar11 << 6;
        uVar11 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                 [uVar9] & 0x3f | uVar2;
        lVar13 = lVar13 + 1;
        if (lVar13 == 4) {
          if (uVar4 == 0) {
            lVar13 = 0;
            uVar4 = 0;
          }
          else {
            *puVar7 = (uchar)(uVar2 >> 0x10);
            if (uVar4 == 1) {
              puVar7 = puVar7 + 1;
              lVar13 = 0;
              uVar4 = 1;
            }
            else {
              puVar7[1] = (uchar)(uVar2 >> 8);
              if (uVar4 < 3) {
                puVar7 = puVar7 + 2;
                lVar13 = 0;
                uVar4 = 2;
              }
              else {
                puVar7[2] = (uchar)uVar11;
                puVar7 = puVar7 + 3;
                lVar13 = 0;
              }
            }
          }
        }
      }
    }
    sVar6 = (long)puVar7 - (long)dst;
  }
  iVar1 = 0;
LAB_00127179:
  *olen = sVar6;
  return iVar1;
}

Assistant:

int mbedtls_base64_decode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    uint32_t j, x;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for( i = n = j = 0; i < slen; i++ )
    {
        /* Skip spaces before checking for EOL */
        x = 0;
        while( i < slen && src[i] == ' ' )
        {
            ++i;
            ++x;
        }

        /* Spaces at end of buffer are OK */
        if( i == slen )
            break;

        if( ( slen - i ) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n' )
            continue;

        if( src[i] == '\n' )
            continue;

        /* Space inside a line is an error */
        if( x != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] == '=' && ++j > 2 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] > 127 || base64_dec_map[src[i]] == 127 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( base64_dec_map[src[i]] < 64 && j != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        n++;
    }

    if( n == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = ( 6 * ( n >> 3 ) ) + ( ( 6 * ( n & 0x7 ) + 7 ) >> 3 );
    n -= j;

    if( dst == NULL || dlen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

   for( j = 3, n = x = 0, p = dst; i > 0; i--, src++ )
   {
        if( *src == '\r' || *src == '\n' || *src == ' ' )
            continue;

        j -= ( base64_dec_map[*src] == 64 );
        x  = ( x << 6 ) | ( base64_dec_map[*src] & 0x3F );

        if( ++n == 4 )
        {
            n = 0;
            if( j > 0 ) *p++ = (unsigned char)( x >> 16 );
            if( j > 1 ) *p++ = (unsigned char)( x >>  8 );
            if( j > 2 ) *p++ = (unsigned char)( x       );
        }
    }

    *olen = p - dst;

    return( 0 );
}